

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::rgbToHSV<float,gimage::PixelTraits<float>>
               (ImageFloat *ret,Image<float,_gimage::PixelTraits<float>_> *image)

{
  float *sat_00;
  long lVar1;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  float *in_RDI;
  work_t wVar2;
  work_t wVar3;
  work_t wVar4;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  long i;
  long k;
  float val;
  float sat;
  float hue;
  work_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  long lVar5;
  Image<float,_gimage::PixelTraits<float>_> *this;
  Image<float,_gimage::PixelTraits<float>_> *hue_00;
  long local_28;
  long in_stack_ffffffffffffffe8;
  float *w;
  
  w = in_RDI;
  sat_00 = (float *)Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (unaff_retaddr,(long)w,(long)in_RSI,in_stack_ffffffffffffffe8);
  local_28 = 0;
  while( true ) {
    lVar5 = local_28;
    lVar1 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    if (lVar1 <= lVar5) break;
    this = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while( true ) {
      hue_00 = this;
      lVar1 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
      if (lVar1 <= (long)this) break;
      wVar2 = Image<float,_gimage::PixelTraits<float>_>::getW(in_RSI,(long)hue_00,local_28,0);
      wVar3 = Image<float,_gimage::PixelTraits<float>_>::getW(in_RSI,(long)hue_00,local_28,1);
      wVar4 = Image<float,_gimage::PixelTraits<float>_>::getW(in_RSI,(long)hue_00,local_28,2);
      Image<float,_gimage::PixelTraits<float>_>::absMaxValue
                ((Image<float,_gimage::PixelTraits<float>_> *)0x169258);
      rgbToHSV<float>((float *)hue_00,sat_00,in_RDI,(float)((ulong)lVar5 >> 0x20),(float)lVar5,
                      (float)((ulong)this >> 0x20),SUB84(this,0));
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar2,wVar4),CONCAT44(wVar3,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar2,wVar4),CONCAT44(wVar3,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar2,wVar4),CONCAT44(wVar3,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      this = (Image<float,_gimage::PixelTraits<float>_> *)((long)&hue_00->depth + 1);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}